

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall
RegisterBuildTestStatFailureAbortsBuild::RegisterBuildTestStatFailureAbortsBuild
          (RegisterBuildTestStatFailureAbortsBuild *this)

{
  RegisterBuildTestStatFailureAbortsBuild *this_local;
  
  RegisterTest(BuildTestStatFailureAbortsBuild::Create,"BuildTest.StatFailureAbortsBuild");
  return;
}

Assistant:

TEST_F(BuildTest, StatFailureAbortsBuild) {
  const string kTooLongToStat(400, 'i');
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
("build " + kTooLongToStat + ": cat in\n").c_str()));
  fs_.Create("in", "");

  // This simulates a stat failure:
  fs_.files_[kTooLongToStat].mtime = -1;
  fs_.files_[kTooLongToStat].stat_error = "stat failed";

  string err;
  EXPECT_FALSE(builder_.AddTarget(kTooLongToStat, &err));
  EXPECT_EQ("stat failed", err);
}